

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O1

Vec_Wec_t * Acec_MatchCopy(Vec_Wec_t *vLits,Vec_Int_t *vMap)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Vec_Wec_t *pVVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  
  iVar1 = vLits->nSize;
  pVVar6 = (Vec_Wec_t *)malloc(0x10);
  iVar9 = 8;
  if (6 < iVar1 - 1U) {
    iVar9 = iVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar9;
  if (iVar9 == 0) {
    pVVar7 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar7 = (Vec_Int_t *)calloc((long)iVar9,0x10);
  }
  pVVar6->pArray = pVVar7;
  pVVar6->nSize = iVar1;
  if (0 < vLits->nSize) {
    lVar10 = 0;
    do {
      pVVar7 = vLits->pArray;
      if (0 < pVVar7[lVar10].nSize) {
        uVar5 = (int)lVar10 + 1;
        lVar11 = 0;
        do {
          uVar2 = pVVar7[lVar10].pArray[lVar11];
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x135,"int Abc_Lit2LitL(int *, int)");
          }
          uVar3 = vMap->pArray[uVar2 >> 1];
          if ((int)uVar3 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          if (pVVar6->nSize <= lVar10) {
            uVar4 = pVVar6->nSize * 2;
            if ((int)uVar4 <= (int)uVar5) {
              uVar4 = uVar5;
            }
            iVar1 = pVVar6->nCap;
            if (iVar1 < (int)uVar4) {
              if (pVVar6->pArray == (Vec_Int_t *)0x0) {
                pVVar8 = (Vec_Int_t *)malloc((ulong)uVar4 << 4);
              }
              else {
                pVVar8 = (Vec_Int_t *)realloc(pVVar6->pArray,(ulong)uVar4 << 4);
              }
              pVVar6->pArray = pVVar8;
              memset(pVVar8 + iVar1,0,(long)(int)(uVar4 - iVar1) << 4);
              pVVar6->nCap = uVar4;
            }
            pVVar6->nSize = uVar5;
          }
          if (pVVar6->nSize <= lVar10) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush(pVVar6->pArray + lVar10,uVar3 ^ uVar2 & 1);
          lVar11 = lVar11 + 1;
        } while (lVar11 < pVVar7[lVar10].nSize);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < vLits->nSize);
  }
  return pVVar6;
}

Assistant:

Vec_Wec_t * Acec_MatchCopy( Vec_Wec_t * vLits, Vec_Int_t * vMap )
{
    Vec_Wec_t * vRes = Vec_WecStart( Vec_WecSize(vLits) );
    Vec_Int_t * vLevel; int i, k, iLit;
    Vec_WecForEachLevel( vLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
            Vec_WecPush( vRes, i, Abc_Lit2LitL(Vec_IntArray(vMap), iLit) );
    return vRes;
}